

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_definition.cpp
# Opt level: O1

void __thiscall
duckdb::ColumnDefinition::SetGeneratedExpression
          (ColumnDefinition *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *new_expr)

{
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var2;
  pointer pcVar3;
  _Alloc_hider _Var4;
  int iVar5;
  pointer pPVar6;
  type expr;
  ParserException *this_00;
  pointer *__ptr;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this->category = GENERATED;
  pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(new_expr);
  iVar5 = (*(pPVar6->super_BaseExpression)._vptr_BaseExpression[4])(pPVar6);
  if ((char)iVar5 != '\0') {
    this_00 = (ParserException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "Expression of generated column \"%s\" contains a subquery, which isn\'t allowed","")
    ;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    pcVar3 = (this->name)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar3,pcVar3 + (this->name)._M_string_length);
    ParserException::ParserException<std::__cxx11::string>(this_00,&local_68,&local_48);
    __cxa_throw(this_00,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  expr = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
         operator*(new_expr);
  VerifyColumnRefs(expr);
  if ((this->type).id_ == ANY) {
    _Var1._M_head_impl =
         (new_expr->
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         ._M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (new_expr->
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t
    .super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    _Var2._M_head_impl =
         (this->expression).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (this->expression).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var1._M_head_impl;
    if (_Var2._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
      return;
    }
  }
  else {
    make_uniq_base<duckdb::ParsedExpression,duckdb::CastExpression,duckdb::LogicalType&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((duckdb *)&local_68,&this->type,new_expr);
    _Var4._M_p = local_68._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)0x0;
    _Var1._M_head_impl =
         (this->expression).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (this->expression).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (ParsedExpression *)_Var4._M_p;
    if (_Var1._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
    }
    if ((long *)local_68._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_68._M_dataplus._M_p + 8))();
    }
  }
  return;
}

Assistant:

void ColumnDefinition::SetGeneratedExpression(unique_ptr<ParsedExpression> new_expr) {
	category = TableColumnType::GENERATED;

	if (new_expr->HasSubquery()) {
		throw ParserException("Expression of generated column \"%s\" contains a subquery, which isn't allowed", name);
	}

	VerifyColumnRefs(*new_expr);
	if (type.id() == LogicalTypeId::ANY) {
		expression = std::move(new_expr);
		return;
	}
	// Always wrap the expression in a cast, that way we can always update the cast when we change the type
	// Except if the type is LogicalType::ANY (no type specified)
	expression = make_uniq_base<ParsedExpression, CastExpression>(type, std::move(new_expr));
}